

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_0::TessCoordComponent::initPrograms
               (SourceCollections *programCollection,CaseDefinition caseDef)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  string local_7a0;
  ShaderSource local_780;
  allocator<char> local_751;
  string local_750;
  string local_730 [32];
  ostringstream local_710 [8];
  ostringstream src_2;
  int local_590;
  int i;
  int numComponents;
  char *components [3];
  ostringstream local_568 [8];
  ostringstream tessCoordSrc;
  string local_3f0;
  ShaderSource local_3d0;
  allocator<char> local_3a1;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream src_1;
  string local_208;
  ShaderSource local_1e8;
  allocator<char> local_1b9;
  string local_1b8;
  ostringstream local_188 [8];
  ostringstream src;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_188,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"vert",&local_1b9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1b8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1e8,&local_208);
  glu::ProgramSources::operator<<(pPVar4,&local_1e8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::__cxx11::ostringstream::ostringstream(local_380);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_380,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(vertices = 1) out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"tesc",&local_3a1);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a0);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_3d0,&local_3f0);
  glu::ProgramSources::operator<<(pPVar4,&local_3d0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::ostringstream::~ostringstream(local_380);
  std::__cxx11::ostringstream::ostringstream(local_568);
  if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE) {
    std::operator<<((ostream *)local_568,"    sb_out.tessCoord[index] = gl_TessCoord;\n");
  }
  else {
    if (caseDef.caseType != CASETYPE_ONE_MINUS_TESS_COORD) goto LAB_00de085a;
    _i = "x";
    components[0] = "y";
    components[1] = "z";
    iVar1 = 2;
    if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      iVar1 = 3;
    }
    for (local_590 = 0; local_590 < iVar1; local_590 = local_590 + 1) {
      poVar3 = std::operator<<((ostream *)local_568,"    {\n");
      poVar3 = std::operator<<(poVar3,"        float oneMinusComp        = 1.0 - gl_TessCoord.");
      poVar3 = std::operator<<(poVar3,*(char **)(&i + (long)local_590 * 2));
      poVar3 = std::operator<<(poVar3,";\n");
      poVar3 = std::operator<<(poVar3,"        sb_out.tessCoord[index].");
      poVar3 = std::operator<<(poVar3,*(char **)(&i + (long)local_590 * 2));
      poVar3 = std::operator<<(poVar3," = gl_TessCoord.");
      poVar3 = std::operator<<(poVar3,*(char **)(&i + (long)local_590 * 2));
      poVar3 = std::operator<<(poVar3," + oneMinusComp;\n");
      std::operator<<(poVar3,"    }\n");
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_710);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_710,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(");
  pcVar2 = getTessPrimitiveTypeShaderName(caseDef.primitiveType);
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pcVar2 = getSpacingModeShaderName(caseDef.spacingMode);
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pcVar2 = getWindingShaderName(caseDef.winding);
  poVar3 = std::operator<<(poVar3,pcVar2);
  pcVar2 = "";
  if (((undefined1  [20])caseDef & (undefined1  [20])0x1) != (undefined1  [20])0x0) {
    pcVar2 = ", point_mode";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,") in;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                          );
  poVar3 = std::operator<<(poVar3,"    int  numInvocations;\n");
  poVar3 = std::operator<<(poVar3,"    vec3 tessCoord[];\n");
  poVar3 = std::operator<<(poVar3,"} sb_out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    int index = atomicAdd(sb_out.numInvocations, 1);\n");
  std::__cxx11::ostringstream::str();
  poVar3 = std::operator<<(poVar3,local_730);
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"tese",&local_751);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_750);
  std::__cxx11::ostringstream::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_780,&local_7a0);
  glu::ProgramSources::operator<<(pPVar4,&local_780);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  std::__cxx11::ostringstream::~ostringstream(local_710);
LAB_00de085a:
  std::__cxx11::ostringstream::~ostringstream(local_568);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream tessCoordSrc;

		if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE)
			tessCoordSrc << "    sb_out.tessCoord[index] = gl_TessCoord;\n";
		else if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD)
		{
			const char* components[]  = { "x" , "y", "z" };
			const int   numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			for (int i = 0; i < numComponents; ++i)
				tessCoordSrc << "    {\n"
							 << "        float oneMinusComp        = 1.0 - gl_TessCoord." << components[i] << ";\n"
							 << "        sb_out.tessCoord[index]." << components[i] << " = gl_TessCoord." << components[i] << " + oneMinusComp;\n"
							 << "    }\n";
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ", "
						 << getWindingShaderName(caseDef.winding)
						 << (caseDef.usePointMode ? ", point_mode" : "") << ") in;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
			<< "    int  numInvocations;\n"
			<< "    vec3 tessCoord[];\n"
			<< "} sb_out;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    int index = atomicAdd(sb_out.numInvocations, 1);\n"
			<< tessCoordSrc.str()
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}